

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_A.cpp
# Opt level: O2

void __thiscall A::~A(A *this)

{
  ostream *poVar1;
  
  spin_mutex_t::lock(&my_io_mutex);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Destroying A of sz=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->n_);
  std::endl<char,std::char_traits<char>>(poVar1);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  if (this->a != (float *)0x0) {
    operator_delete__(this->a);
  }
  if (this->b != (float *)0x0) {
    operator_delete__(this->b);
  }
  if (this->c != (float *)0x0) {
    operator_delete__(this->c);
    return;
  }
  return;
}

Assistant:

~A() {
    LOG("Destroying A of sz=" << n_);
    delete [] a;
    delete [] b;
    delete [] c;
  }